

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountCase::init
          (VaryingOutputCountCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  ContextInfo *this_00;
  NotSupportedError *pNVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *pTVar7;
  VaryingOutputCountShader *this_01;
  EVP_PKEY_CTX *ctx_00;
  char *local_950;
  char *local_948;
  int local_848;
  byte local_841;
  char *pcStack_840;
  bool instanced;
  int local_838;
  int local_834 [3];
  MessageBuilder local_828;
  undefined1 local_6a2;
  allocator<char> local_6a1;
  string local_6a0;
  undefined1 local_67a;
  allocator<char> local_679;
  string local_678;
  MessageBuilder local_658;
  MessageBuilder local_4d8;
  MessageBuilder local_358;
  int local_1d8;
  int local_1d4;
  GLint maxComponents;
  GLint maxVertices;
  int componentsPerVertex;
  MessageBuilder local_1a8;
  int local_28 [2];
  GLint maxTextures;
  deUint32 local_18;
  ContextType local_14;
  VaryingOutputCountCase *local_10;
  VaryingOutputCountCase *this_local;
  
  local_10 = this;
  pRVar3 = Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  local_14.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_18 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_14,(ApiType)local_18);
  if (!bVar1) {
    this_00 = Context::getContextInfo
                        ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_geometry_shader");
    if (!bVar1) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar4,"Tests require GL_EXT_geometry_shader extension or higher context version.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0xe9a);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if (this->m_test == READ_TEXTURE) {
    local_28[0] = 0;
    pRVar3 = Context::getRenderContext
                       ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0x8c29,local_28);
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1a8,(char (*) [39])"GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS = ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_28);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    if (local_28[0] < 1) {
      maxVertices._2_1_ = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentsPerVertex,"Geometry shader texture units required",
                 (allocator<char> *)((long)&maxVertices + 3));
      tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)&componentsPerVertex);
      maxVertices._2_1_ = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  maxComponents = 8;
  local_1d4 = 0;
  local_1d8 = 0;
  pRVar3 = Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x868))(0x8de0,&local_1d4);
  pRVar3 = Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x868))(0x8de1,&local_1d8);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_358,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [35])0xf50dc1);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1d4);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_358);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_4d8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_4d8,(char (*) [43])0xf50de5);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1d8);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4d8);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_658,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_658,(char (*) [25])"Components per vertex = ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&maxComponents);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_658);
  if (0xff < local_1d4) {
    if (0x3ff < local_1d8) {
      iVar2 = local_1d8;
      if (local_1d8 < 0) {
        iVar2 = local_1d8 + 7;
      }
      iVar2 = de::min<int>(local_1d4,iVar2 >> 3);
      this->m_maxEmitCount = iVar2;
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_828,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_828,(char (*) [29])"Rendering 4 n-gons with n = ");
      local_834[2] = 6;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_834 + 2);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0xf95514);
      local_834[1] = 0;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_834 + 1);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0xf95514);
      local_834[0] = this->m_maxEmitCount;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_834);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])", and ");
      local_838 = 10;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_838);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0xfb38cd);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [42])"N is supplied to the geomery shader with ");
      if (this->m_test == READ_ATTRIBUTE) {
        local_948 = "attribute";
      }
      else {
        if (this->m_test == READ_UNIFORM) {
          local_950 = "uniform";
        }
        else {
          local_950 = "texture";
        }
        local_948 = local_950;
      }
      pcStack_840 = local_948;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&stack0xfffffffffffff7c0);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_828);
      local_841 = this->m_mode == MODE_WITH_INSTANCING;
      this_01 = (VaryingOutputCountShader *)operator_new(0x170);
      pRVar3 = Context::getRenderContext
                         ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
      local_848 = (*pRVar3->_vptr_RenderContext[2])();
      ctx_00 = (EVP_PKEY_CTX *)&local_848;
      VaryingOutputCountShader::VaryingOutputCountShader
                (this_01,(ContextType *)ctx_00,this->m_test,this->m_maxEmitCount,
                 (bool)(local_841 & 1));
      this->m_program = this_01;
      iVar2 = GeometryShaderRenderTest::init(&this->super_GeometryShaderRenderTest,ctx_00);
      return iVar2;
    }
    local_6a2 = 1;
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a0,
               "MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS was less than minimum required (1024)",
               &local_6a1);
    tcu::TestError::TestError(pTVar7,&local_6a0);
    local_6a2 = 0;
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_67a = 1;
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_678,
             "MAX_GEOMETRY_OUTPUT_VERTICES was less than minimum required (256)",&local_679);
  tcu::TestError::TestError(pTVar7,&local_678);
  local_67a = 0;
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void VaryingOutputCountCase::init (void)
{
	// Check requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	if (m_test == VaryingOutputCountShader::READ_TEXTURE)
	{
		glw::GLint maxTextures = 0;

		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS, &maxTextures);

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS = " << maxTextures << tcu::TestLog::EndMessage;

		if (maxTextures < 1)
			throw tcu::NotSupportedError("Geometry shader texture units required");
	}

	// Get max emit count
	{
		const int	componentsPerVertex	= 4 + 4; // vec4 pos, vec4 color
		glw::GLint	maxVertices			= 0;
		glw::GLint	maxComponents		= 0;

		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_OUTPUT_VERTICES, &maxVertices);
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &maxComponents);

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_OUTPUT_VERTICES = " << maxVertices << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS = " << maxComponents << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Components per vertex = " << componentsPerVertex << tcu::TestLog::EndMessage;

		if (maxVertices < 256)
			throw tcu::TestError("MAX_GEOMETRY_OUTPUT_VERTICES was less than minimum required (256)");
		if (maxComponents < 1024)
			throw tcu::TestError("MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS was less than minimum required (1024)");

		m_maxEmitCount = de::min(maxVertices, maxComponents / componentsPerVertex);
	}

	// Log what the test tries to do

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering 4 n-gons with n = "
		<< ((VaryingOutputCountShader::EMIT_COUNT_VERTEX_0 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_0)) << ", "
		<< ((VaryingOutputCountShader::EMIT_COUNT_VERTEX_1 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_1)) << ", "
		<< ((VaryingOutputCountShader::EMIT_COUNT_VERTEX_2 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_2)) << ", and "
		<< ((VaryingOutputCountShader::EMIT_COUNT_VERTEX_3 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_3)) << ".\n"
		<< "N is supplied to the geomery shader with "
		<< ((m_test == VaryingOutputCountShader::READ_ATTRIBUTE) ? ("attribute") : (m_test == VaryingOutputCountShader::READ_UNIFORM) ? ("uniform") : ("texture"))
		<< tcu::TestLog::EndMessage;

	// Gen shader
	{
		const bool instanced = (m_mode == MODE_WITH_INSTANCING);

		DE_ASSERT(!m_program);
		m_program = new VaryingOutputCountShader(m_context.getRenderContext().getType(), m_test, m_maxEmitCount, instanced);
	}

	// Case init
	GeometryShaderRenderTest::init();
}